

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom32.cc
# Opt level: O0

int g80_atom32_prep(hwtest_ctx *ctx)

{
  uint32_t uVar1;
  int iVar2;
  hwtest_ctx *ctx_local;
  
  if ((ctx->chipset).card_type == 0x50) {
    if ((ctx->chipset).chipset == 0x50) {
      ctx_local._4_4_ = 0;
    }
    else {
      uVar1 = nva_rd32(ctx->cnum,0x200);
      if ((uVar1 & 0x100000) == 0) {
        printf("Mem controller not up.\n");
        ctx_local._4_4_ = 2;
      }
      else {
        iVar2 = g80_gr_prep(ctx);
        if (iVar2 == 0) {
          iVar2 = g80_gr_compute_prep(ctx);
          if (iVar2 == 0) {
            ctx_local._4_4_ = 1;
          }
          else {
            ctx_local._4_4_ = 3;
          }
        }
        else {
          ctx_local._4_4_ = 3;
        }
      }
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int g80_atom32_prep(struct hwtest_ctx *ctx) {
	if (ctx->chipset.card_type != 0x50)
		return HWTEST_RES_NA;
	if (ctx->chipset.chipset == 0x50)
		return HWTEST_RES_NA;
	if (!(nva_rd32(ctx->cnum, 0x200) & 1 << 20)) {
		printf("Mem controller not up.\n");
		return HWTEST_RES_UNPREP;
	}
	if (g80_gr_prep(ctx))
		return HWTEST_RES_FAIL;
	if (g80_gr_compute_prep(ctx))
		return HWTEST_RES_FAIL;
	return HWTEST_RES_PASS;
}